

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqliteViewResetAll(sqlite3 *db,int idx)

{
  Table *pTable;
  Schema *pSVar1;
  Table *pTab;
  HashElem *i;
  int idx_local;
  sqlite3 *db_local;
  
  if (((db->aDb[idx].pSchema)->schemaFlags & 2) == 2) {
    for (pTab = (Table *)((db->aDb[idx].pSchema)->tblHash).first; pTab != (Table *)0x0;
        pTab = (Table *)pTab->zName) {
      pTable = (Table *)pTab->pIndex;
      if (pTable->pSelect != (Select *)0x0) {
        sqlite3DeleteColumnNames(db,pTable);
        pTable->aCol = (Column *)0x0;
        pTable->nCol = 0;
      }
    }
    pSVar1 = db->aDb[idx].pSchema;
    pSVar1->schemaFlags = pSVar1->schemaFlags & 0xfffd;
  }
  return;
}

Assistant:

static void sqliteViewResetAll(sqlite3 *db, int idx){
  HashElem *i;
  assert( sqlite3SchemaMutexHeld(db, idx, 0) );
  if( !DbHasProperty(db, idx, DB_UnresetViews) ) return;
  for(i=sqliteHashFirst(&db->aDb[idx].pSchema->tblHash); i;i=sqliteHashNext(i)){
    Table *pTab = sqliteHashData(i);
    if( pTab->pSelect ){
      sqlite3DeleteColumnNames(db, pTab);
      pTab->aCol = 0;
      pTab->nCol = 0;
    }
  }
  DbClearProperty(db, idx, DB_UnresetViews);
}